

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__interpenetrate
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  interpenetrate__AttributeData *piVar2;
  StringHash SVar3;
  undefined8 *puVar4;
  long *in_RSI;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  interpenetrate__AttributeData *attributeData;
  ParserChar *in_stack_00000098;
  ParserChar *in_stack_000000a0;
  StringHash in_stack_000000a8;
  ErrorType in_stack_000000b0;
  Severity in_stack_000000b4;
  ParserTemplateBase *in_stack_000000b8;
  void **in_stack_ffffffffffffffb8;
  ParserTemplateBase *in_stack_ffffffffffffffc0;
  undefined8 *local_38;
  bool local_1;
  
  piVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL15::interpenetrate__AttributeData>
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_38 = (undefined8 *)*in_RSI;
  if (local_38 == (undefined8 *)0x0) {
LAB_00a083ff:
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        if ((ParserChar *)*local_38 == (ParserChar *)0x0) goto LAB_00a083ff;
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)*local_38);
        puVar4 = local_38 + 1;
        if (puVar4 == (undefined8 *)0x0) {
          return false;
        }
        local_38 = local_38 + 2;
        if (SVar3 != 0x79f4) break;
        piVar2->sid = (ParserChar *)*puVar4;
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000a8,
                         in_stack_000000a0,in_stack_00000098);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__interpenetrate( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__interpenetrate( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

interpenetrate__AttributeData* attributeData = newData<interpenetrate__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_SID:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__sid_type(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INTERPENETRATE,
            HASH_ATTRIBUTE_SID,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_INTERPENETRATE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}